

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_distefano_1999.h
# Opt level: O2

void __thiscall DiStefano::FirstScan(DiStefano *this)

{
  int iVar1;
  int iVar2;
  Mat1b *pMVar3;
  Mat1i *pMVar4;
  long lVar5;
  long lVar6;
  int *piVar7;
  bool *pbVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  int k;
  uint uVar12;
  int *piVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  int x;
  long lVar18;
  bool bVar19;
  ulong uVar20;
  
  this->i_new_label = 0;
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  lVar9 = 0;
  do {
    if (*(int *)&pMVar3->field_0x8 <= lVar9) {
      return;
    }
    lVar5 = **(long **)&pMVar3->field_0x48;
    lVar6 = *(long *)&pMVar3->field_0x10;
    lVar16 = **(long **)&pMVar4->field_0x48;
    lVar15 = lVar16 * lVar9 + *(long *)&pMVar4->field_0x10;
    lVar16 = lVar15 - lVar16;
    piVar7 = this->a_class;
    pbVar8 = this->a_single;
    for (lVar18 = 0; lVar18 < *(int *)&pMVar3->field_0xc; lVar18 = lVar18 + 1) {
      if (*(char *)(lVar5 * lVar9 + lVar6 + lVar18) == '\0') {
        uVar20 = 0;
      }
      else {
        uVar20 = 0;
        uVar12 = 0;
        uVar10 = 0;
        uVar17 = 0;
        if (lVar9 != 0) {
          uVar17 = 0;
          if (lVar18 != 0) {
            uVar12 = *(uint *)(lVar16 + -4 + lVar18 * 4);
          }
          uVar10 = *(uint *)(lVar16 + lVar18 * 4);
          if (lVar18 < (long)*(int *)&pMVar3->field_0xc + -1) {
            uVar17 = *(uint *)(lVar16 + 4 + lVar18 * 4);
          }
        }
        if (lVar18 != 0) {
          uVar20 = (ulong)*(uint *)(lVar15 + -4 + lVar18 * 4);
        }
        if ((((uVar12 == 0) && (uVar10 == 0)) && (uVar17 == 0)) && ((int)uVar20 == 0)) {
          iVar1 = this->i_new_label;
          lVar14 = (long)iVar1 + 1;
          uVar12 = (uint)lVar14;
          this->i_new_label = uVar12;
          piVar7[(long)iVar1 + 1] = uVar12;
          bVar19 = true;
LAB_0017de17:
          pbVar8[lVar14] = bVar19;
        }
        else {
          if (uVar12 != 0) {
            uVar10 = uVar12;
          }
          uVar11 = (ulong)uVar10;
          if ((int)uVar10 < 1) {
            uVar11 = (ulong)uVar17;
            uVar10 = uVar17;
LAB_0017de69:
            if ((int)uVar10 < 1) goto LAB_0017deac;
          }
          else if (0 < (int)uVar17) {
            iVar1 = piVar7[uVar11];
            iVar2 = piVar7[uVar17];
            if (iVar1 != iVar2) {
              piVar13 = piVar7 + uVar11;
              if (pbVar8[iVar1] == true) {
                *piVar13 = iVar2;
                piVar13 = piVar7 + uVar17;
              }
              else {
                if (pbVar8[iVar2] == false) {
                  for (lVar14 = 1; lVar14 <= this->i_new_label; lVar14 = lVar14 + 1) {
                    if (piVar7[lVar14] == iVar2) {
                      piVar7[lVar14] = iVar1;
                    }
                  }
                  goto LAB_0017de69;
                }
                piVar7[uVar17] = iVar1;
              }
              pbVar8[*piVar13] = false;
            }
          }
          uVar12 = (uint)uVar11;
          if (0 < (int)uVar20) {
            iVar1 = piVar7[uVar11];
            iVar2 = piVar7[uVar20];
            if (iVar1 != iVar2) {
              if (pbVar8[iVar1] == true) {
                piVar7[uVar11] = iVar2;
                iVar1 = piVar7[uVar20];
              }
              else {
                if (pbVar8[iVar2] == false) {
                  for (lVar14 = 1; lVar14 <= this->i_new_label; lVar14 = lVar14 + 1) {
                    if (piVar7[lVar14] == iVar2) {
                      piVar7[lVar14] = iVar1;
                    }
                  }
                  goto LAB_0017dea9;
                }
                piVar7[uVar20] = iVar1;
                iVar1 = piVar7[uVar11];
              }
              lVar14 = (long)iVar1;
              bVar19 = false;
              goto LAB_0017de17;
            }
          }
        }
LAB_0017dea9:
        uVar20 = (ulong)uVar12;
      }
LAB_0017deac:
      *(int *)(lVar15 + lVar18 * 4) = (int)uVar20;
    }
    lVar9 = lVar9 + 1;
  } while( true );
}

Assistant:

void FirstScan()
    {
        i_new_label = 0;

        for (int y = 0; y < img_.rows; y++) {

            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(y);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(y);
            unsigned int* const img_labels_row_prev = (unsigned int *)(((char *)img_labels_row) - img_labels_.step.p[0]);

            for (int x = 0; x < img_.cols; x++) {
                if (img_row[x]) {

                    int lp(0), lq(0), lr(0), ls(0), lx(0); // lMin(INT_MAX);
                    if (y > 0) {
                        if (x > 0)
                            lp = img_labels_row_prev[x - 1];
                        lq = img_labels_row_prev[x];
                        if (x < img_.cols - 1)
                            lr = img_labels_row_prev[x + 1];
                    }
                    if (x > 0)
                        ls = img_labels_row[x - 1];

                    // If everything around is background
                    if (lp == 0 && lq == 0 && lr == 0 && ls == 0) {
                        lx = ++i_new_label;
                        a_class[lx] = lx;
                        a_single[lx] = true;
                    }
                    else {
                        // p
                        lx = lp;
                        // q
                        if (lx == 0)
                            lx = lq;
                        // r
                        if (lx > 0) {
                            if (lr > 0 && a_class[lx] != a_class[lr]) {
                                if (a_single[a_class[lx]]) {
                                    a_class[lx] = a_class[lr];
                                    a_single[a_class[lr]] = false;
                                }
                                else if (a_single[a_class[lr]]) {
                                    a_class[lr] = a_class[lx];
                                    a_single[a_class[lx]] = false;
                                }
                                else {
                                    int i_class = a_class[lr];
                                    for (int k = 1; k <= i_new_label; k++) {
                                        if (a_class[k] == i_class) {
                                            a_class[k] = a_class[lx];
                                        }
                                    }
                                }
                            }
                        }
                        else
                            lx = lr;
                        // s
                        if (lx > 0) {
                            if (ls > 0 && a_class[lx] != a_class[ls]) {
                                if (a_single[a_class[lx]]) {
                                    a_class[lx] = a_class[ls];
                                    a_single[a_class[ls]] = false;
                                }
                                else if (a_single[a_class[ls]]) {
                                    a_class[ls] = a_class[lx];
                                    a_single[a_class[lx]] = false;
                                }
                                else {
                                    int i_class = a_class[ls];
                                    for (int k = 1; k <= i_new_label; k++) {
                                        if (a_class[k] == i_class) {
                                            a_class[k] = a_class[lx];
                                        }
                                    }
                                }
                            }
                        }
                        else
                            lx = ls;
                    }

                    img_labels_row[x] = lx;
                }
                else
                    img_labels_row[x] = 0;
            }
        }
    }